

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::abc::gaf(abc *this,vec3 *wh,vec3 *wi,vec3 *wo)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float_t fVar4;
  float_t fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  fVar1 = wh->z;
  fVar2 = wi->z;
  fVar4 = dot(wh,wi);
  fVar3 = wo->z;
  fVar5 = dot(wh,wo);
  auVar7._0_4_ = fVar1 * fVar2;
  auVar7._4_4_ = fVar1 * fVar3;
  auVar7._8_4_ = fVar1 * 0.0;
  auVar7._12_4_ = fVar1 * 0.0;
  auVar8._4_4_ = fVar5;
  auVar8._0_4_ = fVar4;
  auVar8._8_4_ = extraout_XMM0_Db;
  auVar8._12_4_ = extraout_XMM0_Db_00;
  auVar8 = divps(auVar7,auVar8);
  auVar9._0_4_ = auVar8._0_4_ + auVar8._0_4_;
  auVar9._4_4_ = auVar8._4_4_ + auVar8._4_4_;
  auVar9._8_4_ = auVar8._8_4_ + auVar8._8_4_;
  auVar9._12_4_ = auVar8._12_4_ + auVar8._12_4_;
  auVar6 = minps(_DAT_001a2220,auVar9);
  if (auVar6._4_4_ <= auVar6._0_4_) {
    auVar6._4_12_ = auVar6._4_12_;
    auVar6._0_4_ = auVar6._4_4_;
  }
  return auVar6._0_4_;
}

Assistant:

float_t abc::gaf(const vec3 &wh, const vec3 &wi, const vec3 &wo) const
{
	float_t G1i = min((float_t)1, (float_t)2 * (wh.z * wi.z / dot(wh, wi)));
	float_t G1o = min((float_t)1, (float_t)2 * (wh.z * wo.z / dot(wh, wo)));

	return min(G1i, G1o);
}